

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_edit_string(nk_context *ctx,nk_flags flags,char *memory,int *len,int max,
                       nk_plugin_filter filter)

{
  nk_scroll nVar1;
  uint uVar2;
  nk_window *pnVar3;
  uchar uVar4;
  nk_flags nVar5;
  int iVar6;
  nk_size size;
  code *filter_00;
  float fVar7;
  undefined8 uVar8;
  nk_vec2 nVar9;
  float fVar11;
  undefined1 auVar10 [16];
  int iVar12;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x531c,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  if (memory != (char *)0x0) {
    if (len != (int *)0x0) {
      filter_00 = nk_filter_default;
      if (filter != (nk_plugin_filter)0x0) {
        filter_00 = filter;
      }
      pnVar3 = ctx->current;
      uVar2 = (pnVar3->edit).seq;
      (ctx->text_edit).undo.undo_point = 0;
      (ctx->text_edit).undo.redo_point = 99;
      (ctx->text_edit).undo.undo_char_point = 0;
      (ctx->text_edit).undo.redo_char_point = 999;
      (ctx->text_edit).cursor = 0;
      (ctx->text_edit).select_start = 0;
      (ctx->text_edit).select_end = 0;
      (ctx->text_edit).mode = '\0';
      (ctx->text_edit).cursor_at_end_of_line = '\0';
      (ctx->text_edit).initialized = '\x01';
      (ctx->text_edit).has_preferred_x = '\0';
      (ctx->text_edit).preferred_x = 0.0;
      (ctx->text_edit).single_line = (flags >> 10 & 1) == 0;
      (ctx->text_edit).filter = filter_00;
      (ctx->text_edit).scrollbar.x = 0.0;
      (ctx->text_edit).scrollbar.y = 0.0;
      if (((pnVar3->edit).active == 0) || (uVar2 != (pnVar3->edit).name)) {
        uVar4 = '\0';
      }
      else {
        if ((flags & 0x10) == 0) {
          iVar6 = (pnVar3->edit).cursor;
        }
        else {
          iVar6 = nk_utf_len(memory,*len);
        }
        (ctx->text_edit).cursor = iVar6;
        if ((flags & 0x20) == 0) {
          iVar6 = (pnVar3->edit).cursor;
          uVar8 = CONCAT44(iVar6,iVar6);
        }
        else {
          uVar8._0_4_ = (pnVar3->edit).sel_start;
          uVar8._4_4_ = (pnVar3->edit).sel_end;
        }
        (ctx->text_edit).select_start = (int)uVar8;
        (ctx->text_edit).select_end = (int)((ulong)uVar8 >> 0x20);
        (ctx->text_edit).mode = (pnVar3->edit).mode;
        nVar1 = (pnVar3->edit).scrollbar;
        auVar10._0_8_ = (ulong)nVar1 & 0xffffffff;
        auVar10._8_4_ = nVar1.y;
        auVar10._12_4_ = 0;
        nVar9.x = (float)(SUB168(auVar10 | _DAT_001584b0,0) - (double)DAT_001584b0);
        nVar9.y = (float)(SUB168(auVar10 | _DAT_001584b0,8) - DAT_001584b0._8_8_);
        (ctx->text_edit).scrollbar = nVar9;
        uVar4 = '\x01';
      }
      size = 1;
      if (1 < max) {
        size = (nk_size)(uint)max;
      }
      (ctx->text_edit).active = uVar4;
      iVar6 = (int)size + -1;
      if (*len < iVar6) {
        iVar6 = *len;
      }
      *len = iVar6;
      nk_buffer_init_fixed(&(ctx->text_edit).string.buffer,memory,size);
      (ctx->text_edit).string.len = 0;
      iVar6 = *len;
      (ctx->text_edit).string.buffer.allocated = (long)iVar6;
      iVar6 = nk_utf_len(memory,iVar6);
      (ctx->text_edit).string.len = iVar6;
      nVar5 = nk_edit_buffer(ctx,flags,&ctx->text_edit,filter_00);
      *len = (int)(ctx->text_edit).string.buffer.allocated;
      if ((ctx->text_edit).active != '\0') {
        iVar6 = (ctx->text_edit).select_start;
        (pnVar3->edit).cursor = (ctx->text_edit).cursor;
        (pnVar3->edit).sel_start = iVar6;
        (pnVar3->edit).sel_end = (ctx->text_edit).select_end;
        (pnVar3->edit).mode = (ctx->text_edit).mode;
        nVar9 = (ctx->text_edit).scrollbar;
        fVar7 = nVar9.x;
        iVar6 = (int)fVar7;
        fVar11 = nVar9.y;
        iVar12 = (int)fVar11;
        (pnVar3->edit).scrollbar =
             (nk_scroll)
             (CONCAT44((int)(fVar11 - 2.1474836e+09),(int)(fVar7 - 2.1474836e+09)) &
              CONCAT44(iVar12 >> 0x1f,iVar6 >> 0x1f) | CONCAT44(iVar12,iVar6));
      }
      return nVar5;
    }
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x531e,
                  "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
                 );
  }
  __assert_fail("memory",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x531d,
                "nk_flags nk_edit_string(struct nk_context *, nk_flags, char *, int *, int, nk_plugin_filter)"
               );
}

Assistant:

NK_API nk_flags
nk_edit_string(struct nk_context *ctx, nk_flags flags,
    char *memory, int *len, int max, nk_plugin_filter filter)
{
    nk_hash hash;
    nk_flags state;
    struct nk_text_edit *edit;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(memory);
    NK_ASSERT(len);
    if (!ctx || !memory || !len)
        return 0;

    filter = (!filter) ? nk_filter_default: filter;
    win = ctx->current;
    hash = win->edit.seq;
    edit = &ctx->text_edit;
    nk_textedit_clear_state(&ctx->text_edit, (flags & NK_EDIT_MULTILINE)?
        NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE, filter);

    if (win->edit.active && hash == win->edit.name) {
        if (flags & NK_EDIT_NO_CURSOR)
            edit->cursor = nk_utf_len(memory, *len);
        else edit->cursor = win->edit.cursor;
        if (!(flags & NK_EDIT_SELECTABLE)) {
            edit->select_start = win->edit.cursor;
            edit->select_end = win->edit.cursor;
        } else {
            edit->select_start = win->edit.sel_start;
            edit->select_end = win->edit.sel_end;
        }
        edit->mode = win->edit.mode;
        edit->scrollbar.x = (float)win->edit.scrollbar.x;
        edit->scrollbar.y = (float)win->edit.scrollbar.y;
        edit->active = nk_true;
    } else edit->active = nk_false;

    max = NK_MAX(1, max);
    *len = NK_MIN(*len, max-1);
    nk_str_init_fixed(&edit->string, memory, (nk_size)max);
    edit->string.buffer.allocated = (nk_size)*len;
    edit->string.len = nk_utf_len(memory, *len);
    state = nk_edit_buffer(ctx, flags, edit, filter);
    *len = (int)edit->string.buffer.allocated;

    if (edit->active) {
        win->edit.cursor = edit->cursor;
        win->edit.sel_start = edit->select_start;
        win->edit.sel_end = edit->select_end;
        win->edit.mode = edit->mode;
        win->edit.scrollbar.x = (nk_uint)edit->scrollbar.x;
        win->edit.scrollbar.y = (nk_uint)edit->scrollbar.y;
    }
    return state;
}